

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

float3 tinyusdz::transform(matrix4d *m,float3 *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  array<float,_3UL> aVar4;
  float3 fVar5;
  
  dVar1 = m->m[3][2];
  dVar2 = m->m[3][0];
  dVar3 = m->m[3][1];
  aVar4 = value::MultV<tinyusdz::value::matrix4d,std::array<float,3ul>,double,float,3ul>(m,p);
  fVar5._M_elems[0] = aVar4._M_elems[0] + (float)dVar2;
  fVar5._M_elems[1] = aVar4._M_elems[1] + (float)dVar3;
  fVar5._M_elems[2] = aVar4._M_elems[2] + (float)dVar1;
  return (float3)fVar5._M_elems;
}

Assistant:

value::float3 transform(const value::matrix4d &m, const value::float3 &p) {
  value::float3 tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  // MatTy, VecTy, VecBaseTy, vecN
  return value::MultV<value::matrix4d, value::float3, double, float, 3>(m, p) + tx;
}